

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_max_a_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  uVar4 = (ushort)(env->active_fpu).fpr[ws].fs[0];
  uVar5 = -uVar4;
  if (0 < (short)uVar4) {
    uVar5 = uVar4;
  }
  uVar6 = (ushort)(env->active_fpu).fpr[wt].fs[0];
  uVar7 = -uVar6;
  if (0 < (short)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar7 < uVar5) {
    uVar6 = uVar4;
  }
  *(ushort *)((env->active_fpu).fpr + wd) = uVar6;
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 2);
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 2);
  uVar7 = -uVar5;
  if (0 < (short)uVar5) {
    uVar7 = uVar5;
  }
  uVar6 = -uVar4;
  if (0 < (short)uVar4) {
    uVar6 = uVar4;
  }
  if (uVar6 < uVar7) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 2) = uVar4;
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 4);
  uVar5 = -uVar4;
  if (0 < (short)uVar4) {
    uVar5 = uVar4;
  }
  uVar6 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 4);
  uVar7 = -uVar6;
  if (0 < (short)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar7 < uVar5) {
    uVar6 = uVar4;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 4) = uVar6;
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 6);
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 6);
  uVar7 = -uVar5;
  if (0 < (short)uVar5) {
    uVar7 = uVar5;
  }
  uVar6 = -uVar4;
  if (0 < (short)uVar4) {
    uVar6 = uVar4;
  }
  if (uVar6 < uVar7) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 6) = uVar4;
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 8);
  uVar5 = -uVar4;
  if (0 < (short)uVar4) {
    uVar5 = uVar4;
  }
  uVar6 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 8);
  uVar7 = -uVar6;
  if (0 < (short)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar7 < uVar5) {
    uVar6 = uVar4;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 8) = uVar6;
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 10);
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 10);
  uVar7 = -uVar5;
  if (0 < (short)uVar5) {
    uVar7 = uVar5;
  }
  uVar6 = -uVar4;
  if (0 < (short)uVar4) {
    uVar6 = uVar4;
  }
  if (uVar6 < uVar7) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 10) = uVar4;
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  uVar5 = -uVar4;
  if (0 < (short)uVar4) {
    uVar5 = uVar4;
  }
  uVar6 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  uVar7 = -uVar6;
  if (0 < (short)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar7 < uVar5) {
    uVar6 = uVar4;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = uVar6;
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  uVar7 = -uVar5;
  if (0 < (short)uVar5) {
    uVar7 = uVar5;
  }
  uVar6 = -uVar4;
  if (0 < (short)uVar4) {
    uVar6 = uVar4;
  }
  if (uVar6 < uVar7) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xe) = uVar4;
  return;
}

Assistant:

void helper_msa_max_a_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_max_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_max_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_max_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_max_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_max_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_max_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_max_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_max_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}